

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_add(REF_NODE ref_node,REF_GLOB global,REF_INT *node)

{
  int iVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS status;
  REF_INT insert_point;
  REF_INT location;
  REF_INT *node_local;
  REF_GLOB global_local;
  REF_NODE ref_node_local;
  
  if (global < 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x150,
           "ref_node_add",3,"invalid global node");
    ref_node_local._4_4_ = 3;
  }
  else {
    ref_node_local._4_4_ = ::ref_node_local(ref_node,global,node);
    if (ref_node_local._4_4_ == 0) {
      ref_node_local._4_4_ = 0;
    }
    else if ((ref_node_local._4_4_ == 0) || (ref_node_local._4_4_ == 5)) {
      ref_node_local._4_4_ = ref_node_add_core(ref_node,global,node);
      if (ref_node_local._4_4_ == 0) {
        ref_private_macro_code_rss = 0;
        for (status = ref_node->n + -2; -1 < status; status = status + -1) {
          if (ref_node->sorted_global[status] < global) {
            ref_private_macro_code_rss = status + 1;
            break;
          }
        }
        iVar1 = ref_node->n;
        while (status = iVar1 + -1, ref_private_macro_code_rss < status) {
          ref_node->sorted_global[status] = ref_node->sorted_global[iVar1 + -2];
          iVar1 = status;
        }
        iVar1 = ref_node->n;
        while (status = iVar1 + -1, ref_private_macro_code_rss < status) {
          ref_node->sorted_local[status] = ref_node->sorted_local[iVar1 + -2];
          iVar1 = status;
        }
        ref_node->sorted_global[ref_private_macro_code_rss] = global;
        ref_node->sorted_local[ref_private_macro_code_rss] = *node;
        ref_node_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x156,"ref_node_add",(ulong)ref_node_local._4_4_,"core");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x154,
             "ref_node_add",(ulong)ref_node_local._4_4_,"ref_node_local unexpected status");
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_add(REF_NODE ref_node, REF_GLOB global,
                                REF_INT *node) {
  REF_INT location, insert_point;
  REF_STATUS status;

  if (global < 0) RSS(REF_INVALID, "invalid global node");

  status = ref_node_local(ref_node, global, node);
  if (REF_SUCCESS == status) return REF_SUCCESS;
  RXS(status, REF_NOT_FOUND, "ref_node_local unexpected status");

  RSS(ref_node_add_core(ref_node, global, node), "core");

  /* general case of non-ascending global node, requires:
     search and shift (but looks to see if bigger than last early) */
  insert_point = 0;
  for (location = ref_node_n(ref_node) - 2; location >= 0; location--) {
    if (ref_node->sorted_global[location] < global) {
      insert_point = location + 1;
      break;
    }
  }

  /* shift down to clear insert_point */
  for (location = ref_node_n(ref_node) - 1; location > insert_point; location--)
    ref_node->sorted_global[location] = ref_node->sorted_global[location - 1];
  for (location = ref_node_n(ref_node) - 1; location > insert_point; location--)
    ref_node->sorted_local[location] = ref_node->sorted_local[location - 1];

  /* insert in empty location */
  ref_node->sorted_global[insert_point] = global;
  ref_node->sorted_local[insert_point] = *node;

  return REF_SUCCESS;
}